

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<long>::
linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
          (Earcut<long> *this,
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          *points,bool clockwise)

{
  pointer pMVar1;
  Node *last;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  
  pMVar1 = (points->
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(points->
                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 4;
  lVar3 = lVar6 + -1;
  if (lVar6 == 0) {
    lVar3 = 0;
  }
  pdVar4 = (double *)
           ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                   m_data + 8);
  dVar9 = 0.0;
  lVar7 = 0;
  lVar5 = lVar6;
  while (lVar2 = lVar7, bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
    dVar9 = dVar9 + (*pdVar4 +
                    *(double *)
                     ((long)&pMVar1[lVar3].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                             m_data + 8)) *
                    (pMVar1[lVar3].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                     m_storage.m_data.array[0] -
                    ((plain_array<double,_2,_1,_16> *)(pdVar4 + -1))->array[0]);
    pdVar4 = pdVar4 + 2;
    lVar7 = lVar2 + 1;
    lVar3 = lVar2;
  }
  if (dVar9 <= 0.0 == clockwise) {
    last = (Node *)0x0;
    lVar7 = lVar6 << 4;
    lVar3 = lVar6;
    while( true ) {
      lVar3 = lVar3 + -1;
      if (lVar3 == -1) break;
      last = insertNode<Eigen::Matrix<double,1,2,1,1,2>>
                       (this,this->vertices + lVar3,
                        (Matrix<double,_1,_2,_1,_1,_2> *)
                        ((long)&(points->
                                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[-1].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                m_storage.m_data + lVar7),last);
      lVar7 = lVar7 + -0x10;
    }
  }
  else {
    lVar7 = 0;
    last = (Node *)0x0;
    for (lVar3 = 0; lVar6 != lVar3; lVar3 = lVar3 + 1) {
      last = insertNode<Eigen::Matrix<double,1,2,1,1,2>>
                       (this,this->vertices + lVar3,
                        (Matrix<double,_1,_2,_1,_1,_2> *)
                        ((long)&(((points->
                                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                                m_storage.m_data + lVar7),last);
      lVar7 = lVar7 + 0x10;
    }
  }
  if (last == (Node *)0x0) {
    last = (Node *)0x0;
  }
  else {
    pdVar4 = &last->next->x;
    if ((((last->x == *pdVar4) && (!NAN(last->x) && !NAN(*pdVar4))) &&
        (pdVar4 = &last->next->y, last->y == *pdVar4)) && (!NAN(last->y) && !NAN(*pdVar4))) {
      removeNode(this,last);
      last = last->next;
    }
  }
  this->vertices = this->vertices + lVar6;
  return last;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}